

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<float>::MultAdd
          (TPZMatrix<float> *this,TPZFMatrix<float> *x,TPZFMatrix<float> *y,TPZFMatrix<float> *z,
          float alpha,float beta,int opt)

{
  TPZMatrix<float> *pTVar1;
  TPZFMatrix<float> *pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  float local_80;
  float local_7c;
  int local_78;
  float local_74;
  int64_t local_70;
  float local_68;
  float local_64;
  TPZMatrix<float> *local_60;
  TPZFMatrix<float> *local_58;
  long local_50;
  long local_48;
  int64_t local_40;
  TPZFMatrix<float> *local_38;
  
  local_7c = beta;
  local_78 = opt;
  local_74 = alpha;
  if (((opt == 0) &&
      ((this->super_TPZBaseMatrix).fCol != (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZBaseMatrix).fRow != (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  if (((x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  local_70 = (this->super_TPZBaseMatrix).fRow;
  iVar6 = (this->super_TPZBaseMatrix).fCol;
  lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  local_60 = this;
  local_58 = x;
  PrepareZ(this,y,z,local_7c,local_78);
  local_80 = 0.0;
  if (0 < lVar3) {
    local_50 = 0;
    lVar4 = 0;
    local_48 = lVar3;
    local_40 = iVar6;
    local_38 = z;
    do {
      if (local_78 == 0) {
        if (0 < iVar6) {
          lVar3 = 0;
          do {
            pTVar2 = local_58;
            pTVar1 = local_60;
            if (0 < local_70) {
              lVar5 = 0;
              do {
                if (((z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar5) ||
                   ((z->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar4)) {
                  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_7c = *(float *)((long)z->fElem +
                                     lVar5 * 4 +
                                     (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow * local_50
                                     );
                (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (pTVar1,lVar5,lVar3);
                local_68 = extraout_XMM0_Da_01 * local_74;
                (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(pTVar2,lVar3,lVar4);
                local_80 = extraout_XMM0_Da_02 * local_68 + local_7c;
                (*(z->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                  [0x23])(z,lVar5,lVar4,&local_80);
                lVar5 = lVar5 + 1;
              } while (local_70 != lVar5);
            }
            lVar3 = lVar3 + 1;
            iVar6 = local_40;
          } while (lVar3 != local_40);
        }
      }
      else if (0 < local_70) {
        lVar3 = 0;
        do {
          pTVar2 = local_58;
          pTVar1 = local_60;
          local_80 = 0.0;
          if (0 < iVar6) {
            lVar5 = 0;
            do {
              (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (pTVar1,lVar5,lVar3);
              local_7c = extraout_XMM0_Da;
              (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(pTVar2,lVar5,lVar4);
              local_80 = extraout_XMM0_Da_00 * local_7c + local_80;
              lVar5 = lVar5 + 1;
            } while (iVar6 != lVar5);
          }
          z = local_38;
          local_64 = local_80 * local_74;
          (*(local_38->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(local_38,lVar3,lVar4,&local_64);
          lVar3 = lVar3 + 1;
        } while (lVar3 != local_70);
      }
      lVar4 = lVar4 + 1;
      local_50 = local_50 + 4;
    } while (lVar4 != local_48);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}